

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O3

SRC_ERROR prepare_data(SINC_FILTER *filter,int channels,SRC_DATA *data,int half_filter_chan_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  if ((filter->b_real_end < 0) && (data->data_in != (float *)0x0)) {
    iVar5 = filter->b_current;
    if ((long)iVar5 == 0) {
      iVar2 = filter->b_len;
      iVar5 = iVar2 + half_filter_chan_len * -2;
      filter->b_end = half_filter_chan_len;
      filter->b_current = half_filter_chan_len;
      iVar3 = half_filter_chan_len;
    }
    else {
      iVar3 = filter->b_end;
      iVar2 = filter->b_len;
      if (half_filter_chan_len + channels + iVar3 < iVar2) {
        iVar1 = iVar2 - (iVar5 + half_filter_chan_len);
      }
      else {
        iVar3 = (iVar3 - iVar5) + half_filter_chan_len;
        memmove(filter->buffer,filter->buffer + ((long)iVar5 - (long)half_filter_chan_len),
                (long)iVar3 * 4);
        filter->b_current = half_filter_chan_len;
        filter->b_end = iVar3;
        iVar2 = filter->b_len;
        iVar1 = iVar2 + half_filter_chan_len * -2;
      }
      iVar5 = 0;
      if (0 < iVar1) {
        iVar5 = iVar1;
      }
    }
    iVar1 = (int)filter->in_count - (int)filter->in_used;
    if (iVar5 < iVar1) {
      iVar1 = iVar5;
    }
    uVar4 = iVar1 - iVar1 % channels;
    if ((int)uVar4 < 0) {
      return SRC_ERR_SINC_PREPARE_DATA_BAD_LEN;
    }
    if (iVar2 < (int)(iVar3 + uVar4)) {
      return SRC_ERR_SINC_PREPARE_DATA_BAD_LEN;
    }
    memcpy(filter->buffer + iVar3,data->data_in + filter->in_used,(ulong)uVar4 * 4);
    iVar5 = uVar4 + filter->b_end;
    filter->b_end = iVar5;
    lVar6 = (ulong)uVar4 + filter->in_used;
    filter->in_used = lVar6;
    if (lVar6 == filter->in_count) {
      iVar3 = iVar5 - filter->b_current;
      if (iVar3 < half_filter_chan_len * 2) {
        if (data->end_of_input == 0) {
          return SRC_ERR_NO_ERROR;
        }
        iVar2 = filter->b_len;
        iVar1 = half_filter_chan_len + 5;
        if (iVar2 - iVar5 < iVar1) {
          iVar5 = iVar3 + half_filter_chan_len;
          memmove(filter->buffer,
                  filter->buffer + ((long)filter->b_current - (long)half_filter_chan_len),
                  (long)iVar5 * 4);
          filter->b_current = half_filter_chan_len;
          filter->b_end = iVar5;
          iVar2 = filter->b_len;
        }
        filter->b_real_end = iVar5;
        if (iVar2 < iVar1 + iVar5) {
          iVar1 = iVar2 - iVar5;
        }
        if (half_filter_chan_len < -5) {
          iVar1 = iVar2 - iVar5;
        }
        memset(filter->buffer + iVar5,0,(long)iVar1 * 4);
        filter->b_end = filter->b_end + iVar1;
        return SRC_ERR_NO_ERROR;
      }
    }
  }
  return SRC_ERR_NO_ERROR;
}

Assistant:

static SRC_ERROR
prepare_data (SINC_FILTER *filter, int channels, SRC_DATA *data, int half_filter_chan_len)
{	int len = 0 ;

	if (filter->b_real_end >= 0)
		return SRC_ERR_NO_ERROR ;	/* Should be terminating. Just return. */

	if (data->data_in == NULL)
		return SRC_ERR_NO_ERROR ;

	if (filter->b_current == 0)
	{	/* Initial state. Set up zeros at the start of the buffer and
		** then load new data after that.
		*/
		len = filter->b_len - 2 * half_filter_chan_len ;

		filter->b_current = filter->b_end = half_filter_chan_len ;
		}
	else if (filter->b_end + half_filter_chan_len + channels < filter->b_len)
	{	/*  Load data at current end position. */
		len = MAX (filter->b_len - filter->b_current - half_filter_chan_len, 0) ;
		}
	else
	{	/* Move data at end of buffer back to the start of the buffer. */
		len = filter->b_end - filter->b_current ;
		memmove (filter->buffer, filter->buffer + filter->b_current - half_filter_chan_len,
						(half_filter_chan_len + len) * sizeof (filter->buffer [0])) ;

		filter->b_current = half_filter_chan_len ;
		filter->b_end = filter->b_current + len ;

		/* Now load data at current end of buffer. */
		len = MAX (filter->b_len - filter->b_current - half_filter_chan_len, 0) ;
		} ;

	len = MIN ((int) (filter->in_count - filter->in_used), len) ;
	len -= (len % channels) ;

	if (len < 0 || filter->b_end + len > filter->b_len)
		return SRC_ERR_SINC_PREPARE_DATA_BAD_LEN ;

	memcpy (filter->buffer + filter->b_end, data->data_in + filter->in_used,
						len * sizeof (filter->buffer [0])) ;

	filter->b_end += len ;
	filter->in_used += len ;

	if (filter->in_used == filter->in_count &&
			filter->b_end - filter->b_current < 2 * half_filter_chan_len && data->end_of_input)
	{	/* Handle the case where all data in the current buffer has been
		** consumed and this is the last buffer.
		*/

		if (filter->b_len - filter->b_end < half_filter_chan_len + 5)
		{	/* If necessary, move data down to the start of the buffer. */
			len = filter->b_end - filter->b_current ;
			memmove (filter->buffer, filter->buffer + filter->b_current - half_filter_chan_len,
							(half_filter_chan_len + len) * sizeof (filter->buffer [0])) ;

			filter->b_current = half_filter_chan_len ;
			filter->b_end = filter->b_current + len ;
			} ;

		filter->b_real_end = filter->b_end ;
		len = half_filter_chan_len + 5 ;

		if (len < 0 || filter->b_end + len > filter->b_len)
			len = filter->b_len - filter->b_end ;

		memset (filter->buffer + filter->b_end, 0, len * sizeof (filter->buffer [0])) ;
		filter->b_end += len ;
		} ;

	return SRC_ERR_NO_ERROR ;
}